

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void curses_print_message_core(int turn,char *msg,nh_bool canblock)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int local_58;
  int local_48;
  int local_44;
  char **local_40;
  char **output;
  int local_30;
  int output_count;
  int i;
  nh_bool died;
  int iStack_24;
  nh_bool use_current_line;
  int maxlen;
  int vsize;
  int hsize;
  nh_bool canblock_local;
  char *msg_local;
  int turn_local;
  
  vsize._3_1_ = canblock;
  _hsize = msg;
  msg_local._4_4_ = turn;
  if (msghistory == (message *)0x0) {
    alloc_hist_array();
  }
  if (msg_local._4_4_ < prevturn) {
    prune_messages(msg_local._4_4_);
  }
  if (*_hsize != '\0') {
    if (prevaction < action) {
      skip_more = '\0';
      newline();
    }
    prevturn = msg_local._4_4_;
    prevaction = action;
    store_message(msg_local._4_4_,_hsize);
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_44 = -1;
    }
    else {
      local_44 = msgwin->_maxy + 1;
    }
    iStack_24 = local_44;
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_48 = -1;
    }
    else {
      local_48 = msgwin->_maxx + 1;
    }
    maxlen = local_48;
    i = local_48;
    if (0x4f < local_48) {
      i = 0x4f;
    }
    if (local_44 == 1) {
      i = i + -8;
    }
    if (settings.msg_per_line == '\0') {
      sVar2 = strlen(msglines[curline]);
      sVar3 = strlen(_hsize);
      output_count._3_1_ = sVar2 + sVar3 + 2 < (ulong)(long)i;
    }
    else {
      output_count._3_1_ = (msglines[curline][0] != '\0' ^ 0xffU) & 1;
    }
    iVar1 = strncmp(_hsize,"You die",7);
    output_count._2_1_ = (iVar1 != 0 ^ 0xffU) & 1;
    if ((output_count._3_1_ == 0) || (output_count._2_1_ != 0)) {
      ui_wrap_text(i,_hsize,(int *)((long)&output + 4),&local_40);
      for (local_30 = 0; local_30 < output._4_4_; local_30 = local_30 + 1) {
        if (msglines[curline][0] != '\0') {
          if (vsize._3_1_ != '\0') {
            if (msgwin == (WINDOW_conflict *)0x0) {
              local_58 = -1;
            }
            else {
              local_58 = msgwin->_maxy + 1;
            }
            if (local_58 + -2 < ((curline + 0x28) - last_redraw_curline) % 0x28) {
              more();
              goto LAB_00112d56;
            }
          }
          newline();
        }
LAB_00112d56:
        strcpy(msglines[curline],local_40[local_30]);
      }
      ui_free_wrap(local_40);
    }
    else {
      if (msglines[curline][0] != '\0') {
        strcat(msglines[curline],"  ");
      }
      strcat(msglines[curline],_hsize);
    }
    draw_msgwin();
  }
  return;
}

Assistant:

static void curses_print_message_core(int turn, const char *msg, nh_bool canblock)
{
    int hsize, vsize, maxlen;
    nh_bool use_current_line, died;

    if (!msghistory)
	alloc_hist_array();

    if (turn < prevturn) /* going back in time can happen during replay */
	prune_messages(turn);

    if (!*msg)
	return; /* empty message. done. */

    if (action > prevaction) {
	/* re-enable output if it was stopped and start a new line */
	skip_more = FALSE;
	newline();
    }
    prevturn = turn;
    prevaction = action;

    store_message(turn, msg);

    /*
     * generally we want to put as many messages on one line as possible to
     * maximize space usage. A new line is begun after each player turn or if
     * more() is called via pause_messages(). "You die" also deserves its own line.
     *
     * If the message area is only one line high, space for "--More--" must be
     * reserved at the end of the line, otherwise  --More-- is shown on a new line.
     */
    getmaxyx(msgwin, vsize, hsize);
    maxlen = hsize;
    if (maxlen >= COLNO) maxlen = COLNO - 1;
    if (vsize == 1) maxlen -= 8; /* for "--More--" */

    if (settings.msg_per_line) {
	use_current_line = !msglines[curline][0];
    } else {
	use_current_line = (strlen(msglines[curline]) + strlen(msg) + 2 < maxlen);
    }
    died = !strncmp(msg, "You die", 7);
    if (use_current_line && !died) {
	if (msglines[curline][0])
	    strcat(msglines[curline], "  ");
	strcat(msglines[curline], msg);
    } else {
	int i, output_count;
	char **output;

	ui_wrap_text(maxlen, msg, &output_count, &output);

	for (i = 0; i < output_count; i++) {
	    if (msglines[curline][0]) {
		/*
		 * If we would scroll a message off the screen that
		 * the user hasn't had a chance to look at this redraw,
		 * then run more(), else newline().  Because the
		 * --More-- takes up a line by itself, we need to
		 * offset that by one line.  Thus, a message window of
		 * height 2 requires us to always show a --More-- even
		 * if we're on the first message of the redraw; with
		 * height 3, we can safely newline after the first
		 * line of messages but must --More-- after the
		 * second, etc.  getmaxy() gives the height of the window
		 * minus 1, which is why we only subtract 2 not 3.
		 */
		if (canblock &&
		    (curline + MAX_MSGLINES - last_redraw_curline) %
		    MAX_MSGLINES > getmaxy(msgwin) - 2)
		    more();
		else
		    newline();
	    }
	    strcpy(msglines[curline], output[i]);
	}

	ui_free_wrap(output);
    }

    draw_msgwin();
}